

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_model *
rf_load_model_from_obj
          (rf_model *__return_storage_ptr__,char *filename,rf_allocator allocator,
          rf_allocator temp_allocator,rf_io_callbacks io)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  rf_source_location rVar8;
  rf_source_location rVar9;
  rf_source_location rVar10;
  rf_source_location rVar11;
  rf_source_location rVar12;
  rf_source_location rVar13;
  rf_source_location rVar14;
  rf_model model_00;
  rf_allocator_args rVar15;
  rf_allocator_args rVar16;
  rf_allocator_args rVar17;
  rf_allocator temp_allocator_00;
  rf_allocator temp_allocator_01;
  rf_allocator temp_allocator_02;
  rf_allocator temp_allocator_03;
  rf_allocator temp_allocator_04;
  rf_allocator allocator_00;
  rf_allocator allocator_01;
  undefined1 auVar18 [24];
  undefined1 auVar19 [24];
  undefined1 auVar20 [24];
  undefined1 auVar21 [24];
  rf_model *prVar22;
  int iVar23;
  uint uVar24;
  undefined4 uVar25;
  hash_table_entry_t *ret;
  rf_mesh *prVar26;
  int *piVar27;
  float *__s;
  uint *puVar28;
  size_t sVar29;
  long lVar30;
  uchar *str;
  unsigned_long hash;
  hash_table_entry_t *phVar31;
  float *pfVar32;
  long lVar33;
  long lVar34;
  float *pfVar35;
  long lVar36;
  long lVar37;
  hash_table_t *phVar38;
  char *pcVar39;
  char *pcVar40;
  ulong uVar41;
  rf_model *prVar42;
  long lVar43;
  int iVar44;
  undefined8 *puVar45;
  long lVar46;
  tinyobj_material_t *ptVar47;
  hash_table_t *phVar48;
  int iVar49;
  int iVar50;
  ulong uVar51;
  byte *pbVar52;
  long lVar53;
  long lVar54;
  rf_material_map *prVar55;
  float *pfVar56;
  byte bVar57;
  rf_material_map **pprVar58;
  unsigned_long *puVar59;
  undefined4 *puVar60;
  size_t __n;
  byte *pbVar61;
  long *in_FS_OFFSET;
  bool bVar62;
  byte bVar63;
  float fVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined8 uVar68;
  unsigned_long *puVar69;
  undefined8 uVar70;
  undefined1 in_stack_ffffffffffffe8d8 [80];
  byte *local_16d8;
  hash_table_t *local_16d0;
  unsigned_long *local_16c8;
  float *local_16c0;
  hash_table_entry_t *local_16b8;
  float *local_16b0;
  ulong local_16a8;
  tinyobj_material_t *local_16a0;
  undefined8 *local_1698;
  float *local_1690;
  unsigned_long *local_1688;
  ulong local_1680;
  unsigned_long *local_1678;
  char *local_1670;
  float y;
  char *pcStack_1660;
  ulong local_1658;
  char *local_1650;
  float z;
  char *pcStack_1640;
  undefined8 local_1638;
  void *local_1630;
  rf_allocator_proc *local_1628;
  rf_allocator local_1620;
  hash_table_t material_table;
  char *local_15f0;
  size_t num_lines;
  LineInfo *line_infos;
  unsigned_long *local_15b0;
  char *pcStack_15a8;
  ulong local_15a0;
  char *local_1598;
  char *pcStack_1590;
  undefined8 local_1588;
  char *local_1580;
  char *pcStack_1578;
  ulong local_1570;
  LineInfo *local_1568;
  char *pcStack_1560;
  ulong local_1558;
  char *local_1550;
  char *pcStack_1548;
  ulong local_1540;
  char *local_1538;
  char *pcStack_1530;
  ulong local_1528;
  float *local_1520;
  char *pcStack_1518;
  ulong local_1510;
  size_t num_materials;
  tinyobj_material_t *materials;
  rf_model *local_14f8;
  char *buf;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined4 local_14d8;
  uint uStack_14d4;
  char *local_14d0;
  char *pcStack_14c8;
  undefined8 local_14c0;
  undefined8 local_14b8;
  long lStack_14b0;
  undefined4 local_14a8;
  uint uStack_14a4;
  char *local_14a0;
  char *pcStack_1498;
  undefined8 local_1490;
  undefined8 local_1488;
  long lStack_1480;
  undefined4 local_1478;
  uint uStack_1474;
  char *local_1470;
  char *pcStack_1468;
  undefined8 local_1460;
  undefined8 local_1458;
  long lStack_1450;
  undefined4 local_1448;
  uint uStack_1444;
  char *local_1440;
  char *pcStack_1438;
  undefined8 local_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined4 local_1418;
  uint uStack_1414;
  char *local_1410;
  char *pcStack_1408;
  undefined8 local_1400;
  undefined8 local_13f8;
  size_t sStack_13f0;
  undefined4 local_13e8;
  uint uStack_13e4;
  char *local_13e0;
  char *pcStack_13d8;
  undefined8 local_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined4 local_13b8;
  uint uStack_13b4;
  char *local_13b0;
  char *pcStack_13a8;
  undefined8 local_13a0;
  long local_1398;
  undefined8 uStack_1390;
  undefined4 local_1388;
  char *local_1380;
  char *pcStack_1378;
  undefined8 local_1370;
  undefined8 local_1368;
  long lStack_1360;
  undefined4 local_1358;
  char *local_1350;
  char *pcStack_1348;
  undefined8 local_1340;
  uchar *local_1338;
  undefined8 uStack_1330;
  undefined4 local_1328;
  char *local_1320;
  char *pcStack_1318;
  undefined8 local_1310;
  undefined8 local_1308;
  ulong uStack_1300;
  undefined4 local_12f8;
  char *local_12f0;
  char *pcStack_12e8;
  undefined8 local_12e0;
  undefined8 local_12d8;
  long lStack_12d0;
  undefined4 local_12c8;
  char *local_12c0;
  char *pcStack_12b8;
  undefined8 local_12b0;
  undefined8 local_12a8;
  long lStack_12a0;
  undefined4 local_1298;
  char *local_1290;
  char *pcStack_1288;
  undefined8 local_1280;
  undefined8 local_1278;
  long lStack_1270;
  undefined4 local_1268;
  char *local_1260;
  char *pcStack_1258;
  undefined8 local_1250;
  undefined8 local_1248;
  long lStack_1240;
  undefined4 local_1238;
  char *local_1230;
  char *pcStack_1228;
  undefined8 local_1220;
  undefined8 local_1218;
  long lStack_1210;
  undefined4 local_1208;
  char *local_1200;
  char *pcStack_11f8;
  undefined8 local_11f0;
  undefined8 local_11e8;
  long lStack_11e0;
  undefined4 local_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  char *local_11b8;
  char *pcStack_11b0;
  undefined8 local_11a8;
  char *local_11a0;
  char *pcStack_1198;
  undefined8 local_1190;
  float x;
  int aiStack_1180 [4];
  undefined8 uStack_1170;
  undefined4 auStack_1168 [42];
  size_t len;
  rf_model model;
  char linebuf [4096];
  
  local_1628 = temp_allocator.allocator_proc;
  local_1630 = temp_allocator.user_data;
  local_1620.allocator_proc = allocator.allocator_proc;
  local_1620.user_data = allocator.user_data;
  bVar63 = 0;
  model.bones = (rf_bone_info *)0x0;
  model.bind_pose = (rf_transform *)0x0;
  model.mesh_material = (int *)0x0;
  model.bone_count = 0;
  model.material_count = 0;
  model.materials = (rf_material *)0x0;
  model.mesh_count = 0;
  model.meshes = (rf_mesh *)0x0;
  model.transform.m3 = 0.0;
  model.transform.m7 = 0.0;
  model.transform.m11 = 0.0;
  model.transform.m15 = 0.0;
  model.transform.m2 = 0.0;
  model.transform.m6 = 0.0;
  model.transform.m10 = 0.0;
  model.transform.m14 = 0.0;
  model.transform.m1 = 0.0;
  model.transform.m5 = 0.0;
  model.transform.m9 = 0.0;
  model.transform.m13 = 0.0;
  model.transform.m0 = 0.0;
  model.transform.m4 = 0.0;
  model.transform.m8 = 0.0;
  model.transform.m12 = 0.0;
  lVar33 = *in_FS_OFFSET;
  puVar45 = (undefined8 *)(lVar33 + -0x430);
  in_FS_OFFSET[-0x86] = (long)local_1630;
  in_FS_OFFSET[-0x85] = (long)local_1628;
  line_infos = (LineInfo *)0x0;
  in_FS_OFFSET[-0x84] = (long)io.user_data;
  in_FS_OFFSET[-0x83] = (long)io.file_size_proc;
  num_lines = 0;
  materials = (tinyobj_material_t *)0x0;
  in_FS_OFFSET[-0x82] = (long)io.read_file_proc;
  num_materials = 0;
  buf = (char *)0x0;
  len = 0;
  local_14f8 = __return_storage_ptr__;
  rf_tinyobj_file_reader_callback(filename,&buf,&len);
  local_1698 = puVar45;
  if ((buf == (char *)0x0 || len == 0) ||
     (iVar23 = get_line_infos(buf,len,&line_infos,&num_lines), phVar38 = (hash_table_t *)num_lines,
     iVar23 != 0)) {
    local_11a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_1198 = "rf_load_model_from_obj";
    local_1190 = 0x8259;
    local_1680 = 0;
    rf_log_impl(4,0x17390c,filename);
    local_16b8 = (hash_table_entry_t *)0x0;
    sVar29 = 0;
    local_16a0 = (tinyobj_material_t *)0x0;
    local_15f0 = (char *)0x0;
    local_16c8 = (unsigned_long *)0x0;
    local_1688 = (unsigned_long *)0x0;
    local_1650 = (char *)0x0;
    local_1670 = (char *)0x0;
    pfVar56 = (float *)0x0;
    local_1678 = (unsigned_long *)0x0;
  }
  else {
    local_1520 = (float *)0x1725fc;
    local_1538 = (char *)0x0;
    pcStack_1518 = "tinyobj_parse_obj";
    local_1510 = 0x6be2;
    pcStack_1530 = (char *)(num_lines * 0x170);
    local_1528 = local_1528 & 0xffffffff00000000;
    lVar37 = (*(code *)in_FS_OFFSET[-0x85])(puVar45,1);
    linebuf._0_8_ = anon_var_dwarf_10442;
    linebuf._8_8_ = anon_var_dwarf_14236;
    linebuf[0x10] = '\x18';
    linebuf[0x11] = 'i';
    linebuf[0x12] = '\0';
    linebuf[0x13] = '\0';
    linebuf[0x14] = '\0';
    linebuf[0x15] = '\0';
    linebuf[0x16] = '\0';
    linebuf[0x17] = '\0';
    _x = (hash_table_entry_t *)0x0;
    aiStack_1180[0] = 0x50;
    aiStack_1180[1] = 0;
    aiStack_1180[2] = 0;
    material_table.hashes = (unsigned_long *)(*(code *)in_FS_OFFSET[-0x85])(puVar45,1);
    material_table.entries =
         (hash_table_entry_t *)rf_calloc_wrapper(*(rf_allocator *)(in_FS_OFFSET + -0x86),10,0x20);
    material_table.capacity = 10;
    material_table.n = 0;
    local_1678 = (unsigned_long *)(lVar37 + 0xe8);
    local_1670 = (char *)(lVar37 + 0x20);
    local_16a8 = CONCAT44(local_16a8._4_4_,0xffffffff);
    local_1688 = (unsigned_long *)0x0;
    local_1680 = 0;
    local_16a0 = (tinyobj_material_t *)0x0;
    local_1690 = (float *)0x0;
    local_1650 = (char *)0x0;
    local_16d0 = phVar38;
    phVar48 = (hash_table_t *)0x0;
    local_16b0 = (float *)lVar37;
    while (phVar48 != phVar38) {
      uVar41 = line_infos[(long)phVar48].len;
      if (0xffe < uVar41) {
        __assert_fail("p_len < 4095",
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ,0x6b0f,"int parseLine(Command *, const char *, size_t, int)");
      }
      pfVar56 = (float *)((long)phVar48 * 0x170 + (long)local_16b0);
      pcVar39 = buf + line_infos[(long)phVar48].pos;
      local_16b8 = (hash_table_entry_t *)phVar48;
      memcpy(linebuf,pcVar39,uVar41);
      linebuf[uVar41] = '\0';
      pfVar56[0x5b] = 0.0;
      local_16d8 = (byte *)linebuf;
      local_16c0 = pfVar56;
      skip_space((char **)&local_16d8);
      pbVar52 = local_16d8;
      if (local_16d8 == (byte *)0x0) {
        __assert_fail("token",
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ,0x6b1b,"int parseLine(Command *, const char *, size_t, int)");
      }
      bVar57 = *local_16d8;
      if ((bVar57 == 0) || (bVar57 == 0x23)) goto LAB_00139098;
      if (bVar57 == 0x66) {
        if ((local_16d8[1] == 0x20) || (local_16d8[1] == 9)) {
          local_16d8 = local_16d8 + 2;
          skip_space((char **)&local_16d8);
          uVar41 = 0;
LAB_00138a18:
          pbVar52 = local_16d8;
          bVar57 = *local_16d8;
          if ((0xd < bVar57) || ((0x2401U >> (bVar57 & 0x1f) & 1) == 0)) {
            uVar24 = my_atoi((char *)local_16d8);
            pbVar61 = pbVar52 + 2;
            do {
              local_16d8 = pbVar52 + 1;
              if (bVar57 < 0x30) {
                if ((0x100002201U >> ((ulong)bVar57 & 0x3f) & 1) != 0) {
                  uVar51 = 0x80000000;
                  iVar23 = -0x80000000;
                  goto LAB_00138a88;
                }
                if ((ulong)bVar57 == 0x2f) goto LAB_00138ac9;
              }
              bVar57 = *local_16d8;
              pbVar61 = pbVar61 + 1;
              pbVar52 = local_16d8;
            } while( true );
          }
          local_16c0[0x5b] = 5.60519e-45;
          pcStack_1640 = (char *)CONCAT44(pcStack_1640._4_4_,aiStack_1180[3]);
          _z = (char *)CONCAT44(aiStack_1180[2],aiStack_1180[1]);
          if (0xf < uVar41 * 3) {
            __assert_fail("3 * num_f < TINYOBJ_MAX_FACES_PER_F_LINE",
                          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                          ,0x6b61,"int parseLine(Command *, const char *, size_t, int)");
          }
          lVar37 = 0;
          pcVar39 = local_1670;
          for (lVar54 = 0; lVar54 + 2U < uVar41; lVar54 = lVar54 + 1) {
            uVar25 = pcStack_1640._0_4_;
            pcStack_1660 = (char *)CONCAT44(pcStack_1660._4_4_,pcStack_1640._0_4_);
            _y = _z;
            puVar59 = *(unsigned_long **)((long)&uStack_1170 + lVar37 * 4);
            pcStack_1640 = (char *)CONCAT44(pcStack_1640._4_4_,auStack_1168[lVar37]);
            *(int *)((long)pcVar39 + 8) = aiStack_1180[0];
            *(hash_table_entry_t **)pcVar39 = _x;
            *(char **)((long)pcVar39 + 0xc) = _z;
            *(undefined4 *)((long)pcVar39 + 0x14) = uVar25;
            *(undefined8 *)((long)pcVar39 + 0x18) = *(undefined8 *)((long)&uStack_1170 + lVar37 * 4)
            ;
            *(undefined4 *)((long)pcVar39 + 0x20) = auStack_1168[lVar37];
            *(undefined4 *)((long)local_1678 + lVar54 * 4) = 3;
            lVar37 = lVar37 + 3;
            pcVar39 = (char *)((long)pcVar39 + 0x24);
            _z = (char *)puVar59;
          }
          *(long *)(local_16c0 + 0x38) = lVar37;
          *(long *)(local_16c0 + 0x4a) = lVar54;
          pfVar56 = local_16c0;
          goto LAB_00138ff4;
        }
LAB_00138dea:
        iVar23 = strncmp((char *)local_16d8,"usemtl",6);
        if ((iVar23 == 0) && ((pbVar52[6] == 0x20 || (pbVar52[6] == 9)))) {
          local_16d8 = pbVar52 + 7;
          skip_space((char **)&local_16d8);
          pfVar56 = local_16c0;
          *(char **)(local_16c0 + 0x54) = pcVar39 + ((long)local_16d8 - (long)linebuf);
          sVar29 = length_until_newline
                             ((char *)local_16d8,(size_t)(linebuf + (uVar41 - (long)local_16d8) + 1)
                             );
          pfVar56[0x56] = (float)sVar29;
          pfVar56[0x5b] = 9.80909e-45;
          goto LAB_00138ff4;
        }
        iVar23 = strncmp((char *)pbVar52,"mtllib",6);
        pfVar56 = local_16c0;
        if ((iVar23 == 0) && ((pbVar52[6] == 0x20 || (pbVar52[6] == 9)))) {
          local_16d8 = pbVar52 + 7;
          skip_space((char **)&local_16d8);
          pfVar56 = local_16c0;
          *(char **)(local_16c0 + 0x58) = pcVar39 + ((long)local_16d8 - (long)linebuf);
          sVar29 = length_until_newline
                             ((char *)local_16d8,(size_t)(linebuf + (uVar41 - (long)local_16d8)));
          pfVar56[0x5a] = (float)((int)sVar29 + 1);
          pfVar56[0x5b] = 1.12104e-44;
          goto LAB_00138ff4;
        }
        if (bVar57 == 0x6f) {
          if ((pbVar52[1] == 0x20) || (pbVar52[1] == 9)) {
            pbVar52 = pbVar52 + 2;
            *(char **)(local_16c0 + 0x50) = pcVar39 + ((long)pbVar52 - (long)linebuf);
            sVar29 = length_until_newline
                               ((char *)pbVar52,(size_t)(linebuf + (uVar41 - (long)pbVar52)));
            pfVar56[0x52] = (float)((int)sVar29 + 1);
            pfVar56[0x5b] = 8.40779e-45;
            goto LAB_00138ff4;
          }
        }
        else if ((bVar57 == 0x67) && ((pbVar52[1] == 0x20 || (pbVar52[1] == 9)))) {
          pbVar52 = pbVar52 + 2;
          *(char **)(local_16c0 + 0x4c) = pcVar39 + ((long)pbVar52 - (long)linebuf);
          sVar29 = length_until_newline
                             ((char *)pbVar52,(size_t)(linebuf + (uVar41 - (long)pbVar52)));
          pfVar56[0x4e] = (float)((int)sVar29 + 1);
          pfVar56[0x5b] = 7.00649e-45;
          goto LAB_00138ff4;
        }
      }
      else {
        if (bVar57 != 0x76) goto LAB_00138dea;
        bVar2 = local_16d8[1];
        if (bVar2 != 9) {
          if (bVar2 == 0x74) {
            if ((local_16d8[2] == 0x20) || (local_16d8[2] == 9)) {
              local_16d8 = local_16d8 + 3;
              fVar64 = parseFloat((char **)&local_16d8);
              local_16c8 = (unsigned_long *)CONCAT44(local_16c8._4_4_,fVar64);
              fVar64 = parseFloat((char **)&local_16d8);
              local_16c0[6] = local_16c8._0_4_;
              local_16c0[7] = fVar64;
              local_16c0[0x5b] = 4.2039e-45;
              pfVar56 = local_16c0;
              goto LAB_00138ff4;
            }
          }
          else if (bVar2 == 0x6e) {
            if ((local_16d8[2] == 0x20) || (local_16d8[2] == 9)) {
              local_16d8 = local_16d8 + 3;
              parseFloat3(&x,&y,&z,(char **)&local_16d8);
              local_16c0[3] = x;
              local_16c0[4] = y;
              local_16c0[5] = z;
              local_16c0[0x5b] = 2.8026e-45;
              pfVar56 = local_16c0;
              goto LAB_00138ff4;
            }
          }
          else if (bVar2 == 0x20) goto LAB_0013896b;
          goto LAB_00138dea;
        }
LAB_0013896b:
        local_16d8 = local_16d8 + 2;
        parseFloat3(&x,&y,&z,(char **)&local_16d8);
        *local_16c0 = x;
        local_16c0[1] = y;
        local_16c0[2] = z;
        local_16c0[0x5b] = 1.4013e-45;
        pfVar56 = local_16c0;
LAB_00138ff4:
        switch(pfVar56[0x5b]) {
        case 1.4013e-45:
          local_1650 = (char *)((long)local_1650 + 1);
          break;
        case 2.8026e-45:
          local_1690 = (float *)((long)local_1690 + 1);
          break;
        case 4.2039e-45:
          local_16a0 = (tinyobj_material_t *)((long)local_16a0 + 1);
          break;
        case 5.60519e-45:
          local_1680 = local_1680 + *(long *)(pfVar56 + 0x38);
          local_1688 = (unsigned_long *)((long)local_1688 + *(long *)(pfVar56 + 0x4a));
        }
        uVar25 = (int)local_16a8;
        if (pfVar56[0x5b] == 1.12104e-44) {
          uVar25 = SUB84(local_16b8,0);
        }
        local_16a8 = CONCAT44(local_16a8._4_4_,uVar25);
      }
LAB_00139098:
      local_1678 = (unsigned_long *)((long)local_1678 + 0x170);
      local_1670 = (char *)((long)local_1670 + 0x170);
      puVar45 = local_1698;
      phVar48 = (hash_table_t *)((long)&local_16b8->hash + 1);
    }
    if (line_infos != (LineInfo *)0x0) {
      local_1550 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_1548 = "tinyobj_parse_obj";
      local_1568 = line_infos;
      pcStack_1560 = (char *)0x0;
      local_1540 = 0x6c01;
      local_1558 = local_1558 & 0xffffffff00000000;
      (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
    }
    if (-1 < (int)local_16a8) {
      lVar37 = (local_16a8 & 0xffffffff) * 0x170;
      pcVar39 = *(char **)((long)local_16b0 + 0x160 + lVar37);
      if ((pcVar39 != (char *)0x0) &&
         (uVar41 = (ulong)*(uint *)(lVar37 + (long)local_16b0 + 0x168), uVar41 != 0)) {
        pcVar39 = my_strndup(pcVar39,uVar41);
        uVar24 = tinyobj_parse_and_index_mtl_file
                           (&materials,&num_materials,pcVar39,(file_reader_callback)&material_table,
                            phVar48);
        if (uVar24 != 0) {
          fprintf(_stderr,"TINYOBJ: Failed to parse material file \'%s\': %d\n",pcVar39,
                  (ulong)uVar24);
        }
        local_1580 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_1578 = "tinyobj_parse_obj";
        pcStack_1590 = (char *)0x0;
        local_1570 = 0x6c11;
        local_1588 = (ulong)local_1588._4_4_ << 0x20;
        local_1598 = pcVar39;
        (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
      }
    }
    local_15b0 = (unsigned_long *)0x1725fc;
    pcStack_15a8 = "tinyobj_parse_obj";
    local_15a0 = 0x6c20;
    local_11e8 = 0;
    lStack_11e0 = (long)local_1650 * 0xc;
    local_11d8 = 0;
    local_16b8 = (hash_table_entry_t *)(*(code *)in_FS_OFFSET[-0x85])(puVar45,1);
    local_1200 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_11f8 = "tinyobj_parse_obj";
    local_11f0 = 0x6c22;
    local_1218 = 0;
    lStack_1210 = (long)local_1690 * 0xc;
    local_1208 = 0;
    local_1678 = (unsigned_long *)(*(code *)in_FS_OFFSET[-0x85])(puVar45,1);
    local_1230 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_1228 = "tinyobj_parse_obj";
    local_1220 = 0x6c24;
    local_1248 = 0;
    lStack_1240 = (long)local_16a0 << 3;
    local_1238 = 0;
    local_16c0 = (float *)(*(code *)in_FS_OFFSET[-0x85])(puVar45,1);
    local_1260 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_1258 = "tinyobj_parse_obj";
    local_1250 = 0x6c27;
    local_1278 = 0;
    lStack_1270 = local_1680 * 0xc;
    local_1268 = 0;
    pcVar39 = (char *)(*(code *)in_FS_OFFSET[-0x85])(puVar45,1);
    local_1290 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_1288 = "tinyobj_parse_obj";
    local_1280 = 0x6c29;
    local_12a8 = 0;
    lVar37 = (long)local_1688 << 2;
    local_1298 = 0;
    lStack_12a0 = lVar37;
    local_1650 = (char *)(*(code *)in_FS_OFFSET[-0x85])(puVar45,1);
    local_12c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_12b8 = "tinyobj_parse_obj";
    local_12b0 = 0x6c2a;
    local_12d8 = 0;
    local_12c8 = 0;
    lStack_12d0 = lVar37;
    local_1688 = (unsigned_long *)(*(code *)in_FS_OFFSET[-0x85])(puVar45,1);
    lVar37 = (long)local_16b0 + 0x28;
    lVar54 = (long)local_16b0 + 0xe8;
    uVar25 = 0xffffffff;
    iVar23 = 0;
    lVar53 = 0;
    local_16a8 = 0;
    local_1690 = (float *)0x0;
    local_16c8 = (unsigned_long *)0x0;
    lVar46 = 0;
    local_1670 = pcVar39;
    for (phVar38 = (hash_table_t *)0x0; phVar48 = local_16d0, phVar38 != local_16d0;
        phVar38 = (hash_table_t *)((long)&phVar38->hashes + 1)) {
      iVar44 = *(int *)((long)local_16b0 + 0x16c + (long)phVar38 * 0x170);
      if (6 < iVar44 - 1U) goto switchD_0013961a_caseD_5;
      puVar60 = (undefined4 *)((long)phVar38 * 0x170 + (long)local_16b0);
      switch(iVar44) {
      case 1:
        *(undefined4 *)((long)&local_16b8->hash + (long)local_16c8 * 0xc) = *puVar60;
        *(undefined4 *)((long)&local_16b8->hash + (long)local_16c8 * 0xc + 4) = puVar60[1];
        (&local_16b8->filled)[(long)local_16c8 * 3] = puVar60[2];
        local_16c8 = (unsigned_long *)((long)local_16c8 + 1);
        break;
      case 2:
        lVar30 = lVar53 * 0xc;
        *(undefined4 *)((long)local_1678 + lVar30) = puVar60[3];
        *(undefined4 *)((long)local_1678 + lVar30 + 4) = puVar60[4];
        *(undefined4 *)((long)local_1678 + lVar30 + 8) = puVar60[5];
        lVar53 = lVar53 + 1;
        break;
      case 3:
        local_16c0[local_16a8 * 2] = (float)puVar60[6];
        local_16c0[local_16a8 * 2 + 1] = (float)puVar60[7];
        local_16a8 = local_16a8 + 1;
        break;
      case 4:
        lVar30 = *(long *)(puVar60 + 0x38);
        lVar34 = lVar46 * 0xc;
        lVar43 = 0;
        lVar36 = lVar30;
        while (bVar62 = lVar36 != 0, lVar36 = lVar36 + -1, bVar62) {
          iVar44 = *(int *)(lVar37 + -8 + lVar43);
          iVar3 = *(int *)(lVar37 + -4 + lVar43);
          iVar49 = *(int *)(lVar37 + lVar43);
          iVar50 = (int)local_16c8 + iVar44;
          if (iVar44 == 0) {
            iVar50 = iVar23;
          }
          if (0 < iVar44) {
            iVar50 = iVar44 + -1;
          }
          iVar44 = iVar49 + (int)lVar53;
          if (iVar49 == 0) {
            iVar44 = iVar23;
          }
          if (0 < iVar49) {
            iVar44 = iVar49 + -1;
          }
          iVar49 = (int)local_16a8 + iVar3;
          if (iVar3 == 0) {
            iVar49 = iVar23;
          }
          if (0 < iVar3) {
            iVar49 = iVar3 + -1;
          }
          *(int *)(pcVar39 + lVar43 + lVar34) = iVar50;
          *(int *)(pcVar39 + lVar43 + lVar34 + 8) = iVar44;
          *(int *)(pcVar39 + lVar43 + lVar34 + 4) = iVar49;
          lVar43 = lVar43 + 0xc;
        }
        lVar36 = *(long *)(puVar60 + 0x4a);
        for (lVar34 = 0; lVar36 != lVar34; lVar34 = lVar34 + 1) {
          *(undefined4 *)((long)local_1688 + lVar34 * 4 + (long)local_1690 * 4) = uVar25;
          *(undefined4 *)(local_1650 + lVar34 * 4 + (long)local_1690 * 4) =
               *(undefined4 *)(lVar54 + lVar34 * 4);
        }
        ptVar47 = (tinyobj_material_t *)(lVar46 + lVar30);
        local_1690 = (float *)((long)local_1690 + lVar36);
        local_16a0 = (tinyobj_material_t *)lVar46;
        goto LAB_0013997b;
      case 7:
        if ((*(long *)(puVar60 + 0x54) == 0) || (puVar60[0x56] == 0)) break;
        local_12f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_12e8 = "tinyobj_parse_obj";
        local_12e0 = 0x6c43;
        local_1308 = 0;
        uStack_1300 = (ulong)(puVar60[0x56] + 1);
        local_12f8 = 0;
        local_16a0 = (tinyobj_material_t *)lVar46;
        str = (uchar *)(*(code *)in_FS_OFFSET[-0x85])(local_1698,1);
        memcpy(str,*(void **)(puVar60 + 0x54),(ulong)(uint)puVar60[0x56]);
        str[(uint)puVar60[0x56]] = '\0';
        hash = hash_djb2(str);
        phVar31 = hash_table_find(hash,&material_table);
        uVar25 = 0xffffffff;
        if (phVar31 != (hash_table_entry_t *)0x0) {
          uVar25 = (undefined4)phVar31->value;
        }
        local_1320 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_1318 = "tinyobj_parse_obj";
        uStack_1330 = 0;
        local_1310 = 0x6c4c;
        local_1328 = 0;
        local_1338 = str;
        (*(code *)in_FS_OFFSET[-0x85])(local_1698,3);
        ptVar47 = local_16a0;
        goto LAB_0013997b;
      }
switchD_0013961a_caseD_5:
      ptVar47 = (tinyobj_material_t *)lVar46;
LAB_0013997b:
      lVar37 = lVar37 + 0x170;
      lVar54 = lVar54 + 0x170;
      lVar46 = (long)ptVar47;
    }
    piVar27 = (int *)((long)local_16b0 + 0x16c);
    lVar37 = 0;
    phVar38 = local_16d0;
    while (bVar62 = phVar38 != (hash_table_t *)0x0,
          phVar38 = (hash_table_t *)((long)&phVar38[-1].n + 7), bVar62) {
      lVar37 = lVar37 + (ulong)(*piVar27 - 5U < 2);
      piVar27 = piVar27 + 0x5c;
    }
    local_1350 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_1368 = 0;
    pcStack_1348 = "tinyobj_parse_obj";
    local_1340 = 0x6c8c;
    lStack_1360 = lVar37 * 0x10 + 0x10;
    local_1358 = 0;
    local_16c8 = (unsigned_long *)(*(code *)in_FS_OFFSET[-0x85])(local_1698,1);
    iVar23 = 0;
    local_15f0 = (char *)0x0;
    iVar44 = 0;
    sVar29 = 0;
    pcVar39 = (char *)0x0;
    pfVar56 = local_16b0;
    for (phVar38 = (hash_table_t *)0x0; pfVar32 = local_16b0, phVar38 < phVar48;
        phVar38 = (hash_table_t *)((long)&phVar38->hashes + 1)) {
      uVar41 = sVar29;
      pcVar40 = pcVar39;
      iVar3 = iVar44;
      if (*(int *)((long)pfVar56 + 0x16c) - 5U < 2) {
        lVar37 = (ulong)(*(int *)((long)pfVar56 + 0x16c) == 6) * 0x10;
        uVar24 = *(uint *)(lVar37 + 0x138 + (long)pfVar56);
        uVar41 = (ulong)uVar24;
        pcVar40 = *(char **)(lVar37 + 0x130 + (long)pfVar56);
        if (iVar23 == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = iVar23;
          if (local_15f0 == (char *)0x0) {
            pcVar39 = my_strndup(pcVar39,sVar29);
            *local_16c8 = (unsigned_long)pcVar39;
            *(int *)(local_16c8 + 1) = 0;
            *(int *)((long)local_16c8 + 0xc) = iVar23 - iVar44;
            local_15f0 = (char *)0x1;
          }
          else if (iVar23 - iVar44 != 0) {
            local_16d0 = (hash_table_t *)CONCAT44(local_16d0._4_4_,iVar44);
            local_16a8 = CONCAT44(local_16a8._4_4_,uVar24);
            pcVar39 = my_strndup(pcVar39,sVar29);
            local_16c8[(long)local_15f0 * 2] = (unsigned_long)pcVar39;
            *(int *)(local_16c8 + (long)local_15f0 * 2 + 1) = (int)local_16d0;
            *(int *)((long)local_16c8 + (long)local_15f0 * 0x10 + 0xc) = iVar23 - iVar44;
            uVar41 = local_16a8 & 0xffffffff;
            local_15f0 = local_15f0 + 1;
          }
        }
      }
      iVar44 = iVar3;
      iVar23 = iVar23 + (uint)(*(int *)((long)pfVar56 + 0x16c) == 4);
      pfVar56 = (float *)((long)pfVar56 + 0x170);
      sVar29 = uVar41;
      pcVar39 = pcVar40;
      phVar48 = (hash_table_t *)num_lines;
    }
    if (iVar23 != iVar44 && iVar23 - iVar44 != 0) {
      pcVar39 = my_strndup(pcVar39,sVar29);
      local_16c8[(long)local_15f0 * 2] = (unsigned_long)pcVar39;
      *(int *)(local_16c8 + (long)local_15f0 * 2 + 1) = iVar44;
      *(int *)((long)local_16c8 + (long)local_15f0 * 0x10 + 0xc) = iVar23 - iVar44;
      local_15f0 = local_15f0 + 1;
    }
    puVar45 = local_1698;
    pfVar56 = local_16c0;
    if (pfVar32 != (float *)0x0) {
      local_1380 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_1378 = "tinyobj_parse_obj";
      local_1398 = (long)pfVar32;
      uStack_1390 = 0;
      local_1370 = 0x6cd1;
      local_1388 = 0;
      (*(code *)in_FS_OFFSET[-0x85])(local_1698,3);
    }
    linebuf._0_8_ = anon_var_dwarf_10442;
    linebuf._8_8_ = anon_var_dwarf_14382;
    _x = material_table.entries;
    aiStack_1180[0] = 0;
    aiStack_1180[1] = 0;
    linebuf[0x10] = ' ';
    linebuf[0x11] = 'i';
    linebuf[0x12] = '\0';
    linebuf[0x13] = '\0';
    linebuf[0x14] = '\0';
    linebuf[0x15] = '\0';
    linebuf[0x16] = '\0';
    linebuf[0x17] = '\0';
    aiStack_1180[2] = 0;
    (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
    _y = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_1660 = "destroy_hash_table";
    _z = (char *)material_table.hashes;
    pcStack_1640 = (char *)0x0;
    local_1658 = 0x6921;
    local_1638 = (ulong)local_1638._4_4_ << 0x20;
    (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
    sVar29 = num_materials;
    local_16a0 = materials;
    local_11b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_11b0 = "rf_load_model_from_obj";
    local_11a8 = 0x825d;
    rf_log_impl(2,0x173938,local_15f0,num_materials,filename);
  }
  model.mesh_count = 1;
  local_13b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_13a8 = "rf_load_model_from_obj";
  local_13a0 = 0x8265;
  local_13c8 = 0;
  uStack_13c0 = 0x70;
  local_13b8 = 0;
  rVar8.proc_name._0_4_ = 0x1738f5;
  rVar8.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar8.proc_name._4_4_ = 0;
  rVar8.line_in_file = 0x8265;
  rVar15._16_8_ = (ulong)uStack_13b4 << 0x20;
  rVar15.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x70) << 0x40,0);
  rVar15.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x70) << 0x40,8);
  prVar26 = (rf_mesh *)(*local_1620.allocator_proc)(&local_1620,rVar8,RF_AM_ALLOC,rVar15);
  prVar26->vertex_count = 0;
  prVar26->triangle_count = 0;
  prVar26->vertices = (float *)0x0;
  prVar26->texcoords = (float *)0x0;
  prVar26->texcoords2 = (float *)0x0;
  prVar26->normals = (float *)0x0;
  prVar26->tangents = (float *)0x0;
  prVar26->colors = (uchar *)0x0;
  prVar26->indices = (unsigned_short *)0x0;
  prVar26->anim_vertices = (float *)0x0;
  prVar26->anim_normals = (float *)0x0;
  prVar26->bone_ids = (int *)0x0;
  prVar26->bone_weights = (float *)0x0;
  *(undefined8 *)&prVar26->vao_id = 0;
  prVar26->vbo_id = (uint *)0x0;
  model.meshes = prVar26;
  if (sVar29 != 0) {
    local_13e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_13d8 = "rf_load_model_from_obj";
    local_13d0 = 0x826d;
    local_13f8 = 0;
    __n = sVar29 * 0x98;
    local_13e8 = 0;
    rVar9.proc_name._0_4_ = 0x1738f5;
    rVar9.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar9.proc_name._4_4_ = 0;
    rVar9.line_in_file = 0x826d;
    auVar18._8_8_ = (ulong)uStack_13e4 << 0x20;
    auVar18._0_8_ = __n;
    auVar18._16_8_ = 0;
    sStack_13f0 = __n;
    model.material_count = sVar29;
    model.materials =
         (rf_material *)
         (*local_1620.allocator_proc)
                   (&local_1620,rVar9,RF_AM_ALLOC,(rf_allocator_args)(auVar18 << 0x40));
    memset(model.materials,0,__n);
  }
  local_1410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_1408 = "rf_load_model_from_obj";
  local_1400 = 0x8271;
  local_1428 = 0;
  uStack_1420 = 4;
  local_1418 = 0;
  rVar10.proc_name._0_4_ = 0x1738f5;
  rVar10.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar10.proc_name._4_4_ = 0;
  rVar10.line_in_file = 0x8271;
  rVar16._16_8_ = (ulong)uStack_1414 << 0x20;
  rVar16.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(4) << 0x40,0);
  rVar16.size_to_allocate_or_reallocate = SUB168(ZEXT816(4) << 0x40,8);
  local_16d0 = (hash_table_t *)sVar29;
  piVar27 = (int *)(*local_1620.allocator_proc)(&local_1620,rVar10,RF_AM_ALLOC,rVar16);
  *piVar27 = 0;
  local_1440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  local_1458 = 0;
  pcStack_1438 = "rf_load_model_from_obj";
  local_1430 = 0x827c;
  iVar23 = (int)local_1680;
  local_16a8 = (ulong)(uint)(iVar23 * 9);
  lVar37 = local_16a8 * 4;
  local_1448 = 0;
  rVar11.proc_name._0_4_ = 0x1738f5;
  rVar11.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar11.proc_name._4_4_ = 0;
  rVar11.line_in_file = 0x827c;
  auVar19._8_8_ = (ulong)uStack_1444 << 0x20;
  auVar19._0_8_ = lVar37;
  auVar19._16_8_ = 0;
  lStack_1450 = lVar37;
  model.mesh_material = piVar27;
  local_16b0 = (float *)(*local_1620.allocator_proc)
                                  (&local_1620,rVar11,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar19 << 0x40));
  local_1470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  local_1488 = 0;
  pcStack_1468 = "rf_load_model_from_obj";
  local_1460 = 0x827d;
  uVar24 = iVar23 * 6;
  lStack_1480 = (ulong)uVar24 * 4;
  local_1478 = 0;
  rVar12.proc_name._0_4_ = 0x1738f5;
  rVar12.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar12.proc_name._4_4_ = 0;
  rVar12.line_in_file = 0x827d;
  auVar20._8_8_ = (ulong)uStack_1474 << 0x20;
  auVar20._0_8_ = lStack_1480;
  auVar20._16_8_ = 0;
  __s = (float *)(*local_1620.allocator_proc)
                           (&local_1620,rVar12,RF_AM_ALLOC,(rf_allocator_args)(auVar20 << 0x40));
  local_14a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_1498 = "rf_load_model_from_obj";
  local_1490 = 0x827e;
  local_14b8 = 0;
  local_14a8 = 0;
  rVar13.proc_name._0_4_ = 0x1738f5;
  rVar13.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar13.proc_name._4_4_ = 0;
  rVar13.line_in_file = 0x827e;
  auVar21._8_8_ = (ulong)uStack_14a4 << 0x20;
  auVar21._0_8_ = lVar37;
  auVar21._16_8_ = 0;
  lStack_14b0 = lVar37;
  local_1690 = (float *)(*local_1620.allocator_proc)
                                  (&local_1620,rVar13,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar21 << 0x40));
  local_14d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_14c8 = "rf_load_model_from_obj";
  local_14c0 = 0x827f;
  local_14e8 = 0;
  uStack_14e0 = 0x1c;
  local_14d8 = 0;
  rVar14.proc_name._0_4_ = 0x1738f5;
  rVar14.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar14.proc_name._4_4_ = 0;
  rVar14.line_in_file = 0x827f;
  rVar17._16_8_ = (ulong)uStack_14d4 << 0x20;
  rVar17.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar17.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar28 = (uint *)(*local_1620.allocator_proc)(&local_1620,rVar14,RF_AM_ALLOC,rVar17);
  lVar54 = (long)(int)local_16a8;
  lVar37 = 0;
  memset(local_16b0,0,lVar54 << 2);
  memset(__s,0,(long)(int)uVar24 << 2);
  pfVar32 = local_1690;
  memset(local_1690,0,lVar54 << 2);
  puVar28[0] = 0;
  puVar28[1] = 0;
  puVar28[2] = 0;
  puVar28[3] = 0;
  puVar28[3] = 0;
  puVar28[4] = 0;
  puVar28[5] = 0;
  puVar28[6] = 0;
  local_16a8 = local_1680 & 0xffffffff;
  pfVar35 = local_16b0;
  for (uVar41 = 0; uVar41 != local_16a8; uVar41 = uVar41 + 1) {
    lVar54 = uVar41 * 0x24;
    iVar23 = *(int *)(local_1670 + lVar54 + 4);
    iVar44 = *(int *)(local_1670 + lVar54 + 8);
    iVar3 = *(int *)(local_1670 + lVar54 + 0xc);
    iVar49 = *(int *)(local_1670 + lVar54 + 0x10);
    iVar50 = *(int *)(local_1670 + lVar54 + 0x14);
    iVar4 = *(int *)(local_1670 + lVar54 + 0x18);
    iVar5 = *(int *)(local_1670 + lVar54 + 0x1c);
    iVar6 = *(int *)(local_1670 + lVar54);
    iVar7 = *(int *)(local_1670 + lVar54 + 0x20);
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pfVar35[lVar54] = *(float *)((long)&local_16b8->hash + lVar54 * 4 + (long)(iVar6 * 3) * 4);
    }
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pfVar35[lVar54 + 3] = *(float *)((long)&local_16b8->hash + lVar54 * 4 + (long)(iVar3 * 3) * 4)
      ;
    }
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pfVar35[lVar54 + 6] = *(float *)((long)&local_16b8->hash + lVar54 * 4 + (long)(iVar4 * 3) * 4)
      ;
    }
    __s[lVar37] = pfVar56[(long)iVar23 * 2];
    __s[lVar37 + 1] = 1.0 - pfVar56[iVar23 * 2 + 1];
    __s[lVar37 + 2] = pfVar56[(long)iVar49 * 2];
    __s[lVar37 + 3] = 1.0 - pfVar56[iVar49 * 2 + 1];
    __s[lVar37 + 4] = pfVar56[(long)iVar5 * 2];
    __s[lVar37 + 5] = 1.0 - pfVar56[iVar5 * 2 + 1];
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pfVar32[lVar54] = *(float *)((long)local_1678 + lVar54 * 4 + (long)(iVar44 * 3) * 4);
    }
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pfVar32[lVar54 + 3] = *(float *)((long)local_1678 + lVar54 * 4 + (long)(iVar50 * 3) * 4);
    }
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pfVar32[lVar54 + 6] = *(float *)((long)local_1678 + lVar54 * 4 + (long)(iVar7 * 3) * 4);
    }
    lVar37 = lVar37 + 6;
    pfVar35 = pfVar35 + 9;
    pfVar32 = pfVar32 + 9;
  }
  prVar26->vertex_count = (int)local_1680 * 3;
  prVar26->triangle_count = (int)local_1680;
  prVar26->vertices = local_16b0;
  prVar26->texcoords = __s;
  prVar26->texcoords2 = (float *)0x0;
  prVar26->normals = local_1690;
  prVar26->tangents = (float *)0x0;
  prVar26->colors = (uchar *)0x0;
  prVar26->indices = (unsigned_short *)0x0;
  prVar26->anim_vertices = (float *)0x0;
  prVar26->anim_normals = (float *)0x0;
  prVar26->bone_ids = (int *)0x0;
  *(undefined8 *)((long)&prVar26->bone_ids + 4) = 0;
  *(undefined8 *)((long)&prVar26->bone_weights + 4) = 0;
  prVar26->vbo_id = puVar28;
  iVar23 = 0;
  if ((int)*local_1688 != -1) {
    iVar23 = (int)*local_1688;
  }
  *piVar27 = iVar23;
  pfVar32 = local_16a0->diffuse;
  pprVar58 = &(model.materials)->maps;
  phVar38 = local_16d0;
  local_16c0 = pfVar56;
  while (puVar45 = local_1698, bVar62 = phVar38 != (hash_table_t *)0x0,
        phVar38 = (hash_table_t *)((long)phVar38 - 1), bVar62) {
    allocator_00.allocator_proc = local_1620.allocator_proc;
    allocator_00.user_data = local_1620.user_data;
    rf_load_default_material((rf_material *)linebuf,allocator_00);
    memcpy((rf_material *)(pprVar58 + -0x11),(rf_material *)linebuf,0x98);
    prVar55 = *pprVar58;
    (prVar55->texture).id = (rf__ctx->field_0).default_texture_id;
    (prVar55->texture).width = 1;
    (prVar55->texture).height = 1;
    (prVar55->texture).mipmaps = 1;
    (prVar55->texture).format = RF_UNCOMPRESSED_R8G8B8A8;
    *(undefined4 *)&(prVar55->texture).valid = 0;
    if (*(char **)(pfVar32 + 0x13) != (char *)0x0) {
      prVar55 = *pprVar58;
      temp_allocator_00.allocator_proc = local_1628;
      temp_allocator_00.user_data = local_1630;
      rf_load_texture_from_file
                ((rf_texture2d *)linebuf,*(char **)(pfVar32 + 0x13),temp_allocator_00,io);
      *(undefined8 *)&(prVar55->texture).format = linebuf._16_8_;
      *(undefined8 *)&prVar55->texture = linebuf._0_8_;
      *(undefined8 *)&(prVar55->texture).height = linebuf._8_8_;
    }
    prVar55 = *pprVar58;
    fVar64 = pfVar32[1];
    fVar1 = pfVar32[2];
    (prVar55->color).r = (uchar)(int)(*pfVar32 * 255.0);
    (prVar55->color).g = (uchar)(int)(fVar64 * 255.0);
    (prVar55->color).b = (uchar)(int)(fVar1 * 255.0);
    (prVar55->color).a = 0xff;
    prVar55 = *pprVar58;
    prVar55->value = 0.0;
    if (*(char **)(pfVar32 + 0x15) != (char *)0x0) {
      temp_allocator_01.allocator_proc = local_1628;
      temp_allocator_01.user_data = local_1630;
      rf_load_texture_from_file
                ((rf_texture2d *)linebuf,*(char **)(pfVar32 + 0x15),temp_allocator_01,io);
      *(undefined8 *)&prVar55[1].texture.format = linebuf._16_8_;
      *(undefined8 *)&prVar55[1].texture = linebuf._0_8_;
      *(undefined8 *)&prVar55[1].texture.height = linebuf._8_8_;
      prVar55 = *pprVar58;
    }
    fVar64 = pfVar32[4];
    fVar1 = pfVar32[5];
    prVar55[1].color.r = (uchar)(int)(pfVar32[3] * 255.0);
    prVar55[1].color.g = (uchar)(int)(fVar64 * 255.0);
    prVar55[1].color.b = (uchar)(int)(fVar1 * 255.0);
    prVar55[1].color.a = 0xff;
    prVar55 = *pprVar58;
    prVar55[1].value = 0.0;
    if (*(char **)(pfVar32 + 0x19) != (char *)0x0) {
      temp_allocator_02.allocator_proc = local_1628;
      temp_allocator_02.user_data = local_1630;
      rf_load_texture_from_file
                ((rf_texture2d *)linebuf,*(char **)(pfVar32 + 0x19),temp_allocator_02,io);
      *(undefined8 *)&prVar55[2].texture.format = linebuf._16_8_;
      *(undefined8 *)&prVar55[2].texture = linebuf._0_8_;
      *(undefined8 *)&prVar55[2].texture.height = linebuf._8_8_;
      prVar55 = *pprVar58;
    }
    prVar55[2].color.r = 0xff;
    prVar55[2].color.g = 0xff;
    prVar55[2].color.b = 0xff;
    prVar55[2].color.a = 0xff;
    prVar55 = *pprVar58;
    prVar55[2].value = pfVar32[0xc];
    fVar64 = pfVar32[10];
    fVar1 = pfVar32[0xb];
    prVar55[5].color.r = (uchar)(int)(pfVar32[9] * 255.0);
    prVar55[5].color.g = (uchar)(int)(fVar64 * 255.0);
    prVar55[5].color.b = (uchar)(int)(fVar1 * 255.0);
    prVar55[5].color.a = 0xff;
    if (*(char **)(pfVar32 + 0x1b) != (char *)0x0) {
      prVar55 = *pprVar58;
      temp_allocator_03.allocator_proc = local_1628;
      temp_allocator_03.user_data = local_1630;
      rf_load_texture_from_file
                ((rf_texture2d *)linebuf,*(char **)(pfVar32 + 0x1b),temp_allocator_03,io);
      *(undefined8 *)&prVar55[6].texture.format = linebuf._16_8_;
      *(undefined8 *)&prVar55[6].texture = linebuf._0_8_;
      *(undefined8 *)&prVar55[6].texture.height = linebuf._8_8_;
    }
    pfVar32 = pfVar32 + 0x24;
    pprVar58 = pprVar58 + 0x13;
  }
  if (local_16b8 != (hash_table_entry_t *)0x0) {
    linebuf._0_8_ = anon_var_dwarf_10442;
    linebuf._8_8_ = anon_var_dwarf_1438e;
    _x = local_16b8;
    aiStack_1180[0] = 0;
    aiStack_1180[1] = 0;
    linebuf[0x10] = -0x15;
    linebuf[0x11] = 'l';
    linebuf[0x12] = '\0';
    linebuf[0x13] = '\0';
    linebuf[0x14] = '\0';
    linebuf[0x15] = '\0';
    linebuf[0x16] = '\0';
    linebuf[0x17] = '\0';
    aiStack_1180[2] = 0;
    (*(code *)in_FS_OFFSET[-0x85])(local_1698,3);
  }
  pcVar39 = local_1670;
  pfVar56 = local_16c0;
  if (local_1678 != (unsigned_long *)0x0) {
    material_table.hashes = (unsigned_long *)anon_var_dwarf_10442;
    material_table.entries = (hash_table_entry_t *)anon_var_dwarf_1438e;
    _y = (char *)local_1678;
    pcStack_1660 = (char *)0x0;
    material_table.capacity = 0x6cec;
    local_1658 = local_1658 & 0xffffffff00000000;
    (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
  }
  if (pfVar56 != (float *)0x0) {
    _z = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_1640 = "tinyobj_attrib_free";
    local_1520 = pfVar56;
    pcStack_1518 = (char *)0x0;
    local_1638 = 0x6ced;
    local_1510 = local_1510 & 0xffffffff00000000;
    (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
  }
  if (pcVar39 != (char *)0x0) {
    local_1538 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_1530 = "tinyobj_attrib_free";
    local_1550 = pcVar39;
    pcStack_1548 = (char *)0x0;
    local_1528 = 0x6cee;
    local_1540 = local_1540 & 0xffffffff00000000;
    (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
  }
  puVar59 = local_16c8;
  if (local_1650 != (char *)0x0) {
    local_1568 = (LineInfo *)0x1725fc;
    pcStack_1560 = "tinyobj_attrib_free";
    local_1580 = local_1650;
    pcStack_1578 = (char *)0x0;
    local_1558 = 0x6cef;
    local_1570 = local_1570 & 0xffffffff00000000;
    (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
  }
  local_1598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_1590 = "tinyobj_attrib_free";
  local_15b0 = local_1688;
  pcStack_15a8 = (char *)0x0;
  local_1588 = 0x6cf0;
  local_15a0 = local_15a0 & 0xffffffff00000000;
  uVar70 = 0;
  puVar69 = local_1688;
  uVar41 = local_15a0;
  (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
  if (puVar59 != (unsigned_long *)0x0) {
    while (bVar62 = local_15f0 != (char *)0x0, local_15f0 = local_15f0 + -1, bVar62) {
      if ((hash_table_entry_t *)*puVar59 != (hash_table_entry_t *)0x0) {
        linebuf._0_8_ = anon_var_dwarf_10442;
        linebuf._8_8_ = anon_var_dwarf_1439a;
        aiStack_1180[0] = 0;
        aiStack_1180[1] = 0;
        linebuf[0x10] = -8;
        linebuf[0x11] = 'l';
        linebuf[0x12] = '\0';
        linebuf[0x13] = '\0';
        linebuf[0x14] = '\0';
        linebuf[0x15] = '\0';
        linebuf[0x16] = '\0';
        linebuf[0x17] = '\0';
        aiStack_1180[2] = 0;
        _x = (hash_table_entry_t *)*puVar59;
        (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
      }
      puVar59 = puVar59 + 2;
    }
    material_table.hashes = (unsigned_long *)anon_var_dwarf_10442;
    material_table.entries = (hash_table_entry_t *)anon_var_dwarf_1439a;
    _y = (char *)local_16c8;
    pcStack_1660 = (char *)0x0;
    material_table.capacity = 0x6cfb;
    local_1658 = local_1658 & 0xffffffff00000000;
    uVar70 = 0;
    puVar69 = local_16c8;
    uVar41 = local_1658;
    (*(code *)in_FS_OFFSET[-0x85])(puVar45,3);
  }
  tinyobj_materials_free(local_16a0,(size_t)local_16d0);
  *puVar45 = 0;
  puVar45[1] = 0;
  *(undefined8 *)(lVar33 + -0x420) = 0;
  *(undefined8 *)(lVar33 + -0x418) = 0;
  *(undefined8 *)(lVar33 + -0x410) = 0;
  local_11d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  uStack_11c8 = "rf_load_model_from_obj";
  local_11c0 = 0x82ff;
  uVar68 = 0x82ff;
  local_11d0._0_4_ = 0x1725fc;
  local_11d0._4_4_ = 0;
  uStack_11c8._0_4_ = 0x1738f5;
  uStack_11c8._4_4_ = 0;
  uVar25 = (undefined4)local_11d0;
  uVar65 = local_11d0._4_4_;
  uVar66 = (undefined4)uStack_11c8;
  uVar67 = uStack_11c8._4_4_;
  rf_log_impl(2,0x17397f,filename);
  allocator_01.allocator_proc = local_1620.allocator_proc;
  allocator_01.user_data = local_1620.user_data;
  prVar42 = &model;
  puVar45 = (undefined8 *)&stack0xffffffffffffe8a8;
  for (lVar33 = 0x10; prVar22 = local_14f8, lVar33 != 0; lVar33 = lVar33 + -1) {
    *puVar45 = *(undefined8 *)&prVar42->transform;
    prVar42 = (rf_model *)((long)prVar42 + (ulong)bVar63 * -0x10 + 8);
    puVar45 = puVar45 + (ulong)bVar63 * -2 + 1;
  }
  temp_allocator_04.allocator_proc = local_1628;
  temp_allocator_04.user_data = local_1630;
  model_00.transform.m4 = (float)uVar65;
  model_00.transform.m0 = (float)uVar25;
  model_00.transform.m8 = (float)uVar66;
  model_00.transform.m12 = (float)uVar67;
  model_00.transform.m1 = (float)(int)uVar68;
  model_00.transform.m5 = (float)(int)((ulong)uVar68 >> 0x20);
  model_00.transform._24_8_ = puVar69;
  model_00.transform.m2 = (float)(int)uVar70;
  model_00.transform.m6 = (float)(int)((ulong)uVar70 >> 0x20);
  model_00.transform.m10 = (float)(int)uVar41;
  model_00.transform.m14 = (float)(int)(uVar41 >> 0x20);
  model_00.transform.m3 = (float)in_stack_ffffffffffffe8d8._0_4_;
  model_00.transform.m7 = (float)in_stack_ffffffffffffe8d8._4_4_;
  model_00.transform.m11 = (float)in_stack_ffffffffffffe8d8._8_4_;
  model_00.transform.m15 = (float)in_stack_ffffffffffffe8d8._12_4_;
  model_00.mesh_count = in_stack_ffffffffffffe8d8._16_8_;
  model_00.meshes = (rf_mesh *)in_stack_ffffffffffffe8d8._24_8_;
  model_00.material_count = in_stack_ffffffffffffe8d8._32_8_;
  model_00.materials = (rf_material *)in_stack_ffffffffffffe8d8._40_8_;
  model_00.mesh_material = (int *)in_stack_ffffffffffffe8d8._48_8_;
  model_00.bone_count = in_stack_ffffffffffffe8d8._56_8_;
  model_00.bones = (rf_bone_info *)in_stack_ffffffffffffe8d8._64_8_;
  model_00.bind_pose = (rf_transform *)in_stack_ffffffffffffe8d8._72_8_;
  rf_load_meshes_and_materials_for_model(local_14f8,model_00,allocator_01,temp_allocator_04);
  return prVar22;
LAB_00138ac9:
  local_16c8 = (unsigned_long *)CONCAT44(local_16c8._4_4_,uVar24);
  bVar57 = *local_16d8;
  if (bVar57 != 0x2f) {
    uVar24 = my_atoi((char *)local_16d8);
    uVar51 = (ulong)uVar24;
    pbVar52 = pbVar61;
    do {
      if (bVar57 < 0x30) {
        if ((0x100002201U >> ((ulong)bVar57 & 0x3f) & 1) != 0) {
          pbVar52 = pbVar52 + -1;
          iVar23 = -0x80000000;
          phVar38 = local_16d0;
          uVar24 = (uint)local_16c8._0_4_;
          goto LAB_00138a88;
        }
        if ((ulong)bVar57 == 0x2f) goto LAB_00138b90;
      }
      bVar57 = *pbVar52;
      pbVar52 = pbVar52 + 1;
    } while( true );
  }
  pbVar52 = pbVar52 + 2;
  local_16d8 = pbVar52;
  iVar23 = my_atoi((char *)pbVar52);
  while ((0x2f < (ulong)*pbVar52 || ((0x800100002201U >> ((ulong)*pbVar52 & 0x3f) & 1) == 0))) {
    pbVar52 = pbVar52 + 1;
  }
  uVar51 = 0x80000000;
  phVar38 = local_16d0;
  uVar24 = (uint)local_16c8._0_4_;
LAB_00138a88:
  while (((ulong)*pbVar52 < 0x21 && ((0x100002200U >> ((ulong)*pbVar52 & 0x3f) & 1) != 0))) {
    pbVar52 = pbVar52 + 1;
  }
  *(ulong *)(&x + uVar41 * 3) = uVar51 << 0x20 | (ulong)uVar24;
  aiStack_1180[uVar41 * 3] = iVar23;
  uVar41 = uVar41 + 1;
  local_16d8 = pbVar52;
  goto LAB_00138a18;
LAB_00138b90:
  local_16d8 = pbVar52;
  iVar23 = my_atoi((char *)pbVar52);
  while ((0x2f < (ulong)*pbVar52 ||
         (phVar38 = local_16d0, uVar24 = (uint)local_16c8._0_4_,
         (0x800100002201U >> ((ulong)*pbVar52 & 0x3f) & 1) == 0))) {
    pbVar52 = pbVar52 + 1;
  }
  goto LAB_00138a88;
}

Assistant:

RF_API rf_model rf_load_model_from_obj(const char* filename, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_model model  = {0};
    allocator = allocator;

    tinyobj_attrib_t attrib     = {0};
    tinyobj_shape_t* meshes     = NULL;
    size_t           mesh_count = 0;

    tinyobj_material_t* materials      = NULL;
    size_t              material_count = 0;

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator); // Set to NULL at the end of the function
    RF_SET_TINYOBJ_IO_CALLBACKS(io);
    {
        unsigned int flags = TINYOBJ_FLAG_TRIANGULATE;
        int ret            = tinyobj_parse_obj(&attrib, &meshes, (size_t*) &mesh_count, &materials, &material_count, filename, rf_tinyobj_file_reader_callback, flags);

        if (ret != TINYOBJ_SUCCESS)
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "Model data could not be loaded. Filename %s", filename);
        }
        else
        {
            RF_LOG(RF_LOG_TYPE_INFO, "Model data loaded successfully: %i meshes / %i materials, filename: %s", mesh_count, material_count, filename);
        }

        // Init model meshes array
        {
            // TODO: Support multiple meshes... in the meantime, only one mesh is returned
            //model.mesh_count = mesh_count;
            model.mesh_count = 1;
            model.meshes     = (rf_mesh*) RF_ALLOC(allocator, model.mesh_count * sizeof(rf_mesh));
            memset(model.meshes, 0, model.mesh_count * sizeof(rf_mesh));
        }

        // Init model materials array
        if (material_count > 0)
        {
            model.material_count = material_count;
            model.materials      = (rf_material*) RF_ALLOC(allocator, model.material_count * sizeof(rf_material));
            memset(model.materials, 0, model.material_count * sizeof(rf_material));
        }

        model.mesh_material = (int*) RF_ALLOC(allocator, model.mesh_count * sizeof(int));
        memset(model.mesh_material, 0, model.mesh_count * sizeof(int));

        // Init model meshes
        for (rf_int m = 0; m < 1; m++)
        {
            rf_mesh mesh = (rf_mesh)
            {
                .vertex_count   = attrib.num_faces * 3,
                .triangle_count = attrib.num_faces,

                .vertices  = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 3 * sizeof(float)),
                .texcoords = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 2 * sizeof(float)),
                .normals   = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 3 * sizeof(float)),
                .vbo_id    = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO            * sizeof(unsigned int)),
            };

            memset(mesh.vertices,  0, mesh.vertex_count * 3 * sizeof(float));
            memset(mesh.texcoords, 0, mesh.vertex_count * 2 * sizeof(float));
            memset(mesh.normals,   0, mesh.vertex_count * 3 * sizeof(float));
            memset(mesh.vbo_id,    0, RF_MAX_MESH_VBO       * sizeof(unsigned int));

            int vCount  = 0;
            int vtCount = 0;
            int vnCount = 0;

            for (rf_int f = 0; f < attrib.num_faces; f++)
            {
                // Get indices for the face
                tinyobj_vertex_index_t idx0 = attrib.faces[3 * f + 0];
                tinyobj_vertex_index_t idx1 = attrib.faces[3 * f + 1];
                tinyobj_vertex_index_t idx2 = attrib.faces[3 * f + 2];

                // RF_LOG(RF_LOG_TYPE_DEBUG, "Face %i index: v %i/%i/%i . vt %i/%i/%i . vn %i/%i/%i\n", f, idx0.v_idx, idx1.v_idx, idx2.v_idx, idx0.vt_idx, idx1.vt_idx, idx2.vt_idx, idx0.vn_idx, idx1.vn_idx, idx2.vn_idx);

                // Fill vertices buffer (float) using vertex index of the face
                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx0.v_idx * 3 + v]; }
                vCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx1.v_idx * 3 + v]; }
                vCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx2.v_idx * 3 + v]; }
                vCount +=3;

                // Fill texcoords buffer (float) using vertex index of the face
                // NOTE: Y-coordinate must be flipped upside-down
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx0.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx0.vt_idx * 2 + 1]; vtCount += 2;
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx1.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx1.vt_idx * 2 + 1]; vtCount += 2;
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx2.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx2.vt_idx * 2 + 1]; vtCount += 2;

                // Fill normals buffer (float) using vertex index of the face
                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx0.vn_idx * 3 + v]; }
                vnCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx1.vn_idx * 3 + v]; }
                vnCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx2.vn_idx * 3 + v]; }
                vnCount +=3;
            }

            model.meshes[m] = mesh; // Assign mesh data to model

            // Assign mesh material for current mesh
            model.mesh_material[m] = attrib.material_ids[m];

            // Set unfound materials to default
            if (model.mesh_material[m] == -1) { model.mesh_material[m] = 0; }
        }

        // Init model materials
        for (rf_int m = 0; m < material_count; m++)
        {
            // Init material to default
            // NOTE: Uses default shader, only RF_MAP_DIFFUSE supported
            model.materials[m] = rf_load_default_material(allocator);
            model.materials[m].maps[RF_MAP_DIFFUSE].texture = rf_get_default_texture(); // Get default texture, in case no texture is defined

            if (materials[m].diffuse_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_DIFFUSE].texture = rf_load_texture_from_file(materials[m].diffuse_texname, temp_allocator, io); //char* diffuse_texname; // map_Kd
            }

            model.materials[m].maps[RF_MAP_DIFFUSE].color = (rf_color)
            {
                (float)(materials[m].diffuse[0] * 255.0f),
                (float)(materials[m].diffuse[1] * 255.0f),
                (float)(materials[m].diffuse[2] * 255.0f),
                255
            };

            model.materials[m].maps[RF_MAP_DIFFUSE].value = 0.0f;

            if (materials[m].specular_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_SPECULAR].texture = rf_load_texture_from_file(materials[m].specular_texname, temp_allocator, io); //char* specular_texname; // map_Ks
            }

            model.materials[m].maps[RF_MAP_SPECULAR].color = (rf_color)
            {
                (float)(materials[m].specular[0] * 255.0f),
                (float)(materials[m].specular[1] * 255.0f),
                (float)(materials[m].specular[2] * 255.0f),
                255
            };

            model.materials[m].maps[RF_MAP_SPECULAR].value = 0.0f;

            if (materials[m].bump_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_NORMAL].texture = rf_load_texture_from_file(materials[m].bump_texname, temp_allocator, io); //char* bump_texname; // map_bump, bump
            }

            model.materials[m].maps[RF_MAP_NORMAL].color = RF_WHITE;
            model.materials[m].maps[RF_MAP_NORMAL].value = materials[m].shininess;

            model.materials[m].maps[RF_MAP_EMISSION].color = (rf_color)
            {
                (float)(materials[m].emission[0] * 255.0f),
                (float)(materials[m].emission[1] * 255.0f),
                (float)(materials[m].emission[2] * 255.0f),
                255
            };

            if (materials[m].displacement_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_HEIGHT].texture = rf_load_texture_from_file(materials[m].displacement_texname, temp_allocator, io); //char* displacement_texname; // disp
            }
        }

        tinyobj_attrib_free(&attrib);
        tinyobj_shapes_free(meshes, mesh_count);
        tinyobj_materials_free(materials, material_count);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);
    RF_SET_TINYOBJ_IO_CALLBACKS(RF_NULL_IO);

    // NOTE: At this point we have all model data loaded
    RF_LOG(RF_LOG_TYPE_INFO, "Model loaded successfully in RAM. Filename: %s", filename);

    return rf_load_meshes_and_materials_for_model(model, allocator, temp_allocator);
}